

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_MapInOneof_Test::
~ParseErrorTest_MapInOneof_Test(ParseErrorTest_MapInOneof_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseErrorTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, MapInOneof) {
  ExpectHasErrors(
      "message TestMessage {\n"
      "  oneof foo {\n"
      "    map<int32, int32> foo_map = 1;\n"
      "    map message_field = 2;\n"  // a normal message field is OK
      "  }\n"
      "}\n",
      "2:7: Map fields are not allowed in oneofs.\n");
}